

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O1

Complex __thiscall libDAI::IJGP::logZ(IJGP *this)

{
  pointer pVVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  pointer pVVar7;
  pointer in_XMM1_Qa;
  undefined1 auVar8 [64];
  Complex CVar9;
  undefined1 local_d8 [48];
  TFactor<double> local_a8;
  TFactor<double> local_68;
  
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x100) ==
      *(long *)(CONCAT44(extraout_var,iVar2) + 0xf8)) {
    local_d8._0_16_ = ZEXT816(0);
  }
  else {
    local_d8._0_16_ = ZEXT816(0);
    lVar4 = 0x20;
    uVar5 = 0;
    lVar6 = 0x20;
    do {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pVVar1 = *(pointer *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0xf8) + lVar6);
      pVVar7 = pVVar1;
      TProb<double>::entropy
                ((TProb<double> *)
                 ((long)&(((this->_Qb).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar1;
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar7;
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish = in_XMM1_Qa;
      std::complex<double>::operator*=((complex<double> *)&local_a8,(complex<double> *)&local_68);
      local_d8._8_8_ =
           (double)local_d8._8_8_ +
           (double)local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      local_d8._0_8_ =
           (double)local_d8._0_8_ +
           (double)local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar6 = lVar6 + 0x28;
      lVar4 = lVar4 + 0x38;
    } while (uVar5 < (ulong)((*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x100) -
                              *(long *)(CONCAT44(extraout_var_01,iVar2) + 0xf8) >> 3) *
                            -0x3333333333333333));
  }
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  lVar4 = CONCAT44(extraout_var_02,iVar2);
  auVar8 = ZEXT1664(local_d8._0_16_);
  vshufpd_avx(local_d8._0_16_,local_d8._0_16_,1);
  uVar3 = extraout_RDX;
  if (*(long *)(lVar4 + 0xe8) != *(long *)(lVar4 + 0xe0)) {
    uVar5 = 0;
    do {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pVVar1 = *(pointer *)(*(long *)(CONCAT44(extraout_var_03,iVar2) + 0xe0) + 0x38 + uVar5 * 0x40)
      ;
      pVVar7 = pVVar1;
      TProb<double>::entropy
                (&(this->_Qa).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5]._p);
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish = auVar8._0_8_;
      local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar1;
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar7;
      std::complex<double>::operator*=((complex<double> *)&local_a8,(complex<double> *)&local_68);
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      TFactor<double>::log0
                (&local_68,
                 (TFactor<double> *)
                 (uVar5 * 0x40 + *(long *)(CONCAT44(extraout_var_04,iVar2) + 0xe0)));
      TFactor<double>::operator*
                (&local_a8,&local_68,
                 (this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5);
      if ((long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar4 = (long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + 1;
        } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
      }
      if (local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar4 = CONCAT44(extraout_var_05,iVar2);
      uVar3 = extraout_RDX_00;
    } while (uVar5 < (ulong)(*(long *)(lVar4 + 0xe8) - *(long *)(lVar4 + 0xe0) >> 6));
  }
  CVar9._M_value._8_8_ = uVar3;
  CVar9._M_value._0_8_ = lVar4;
  return (Complex)CVar9._M_value;
}

Assistant:

Complex IJGP::logZ() const {
        Complex sum = 0.0;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum += Complex(grm().IR(beta).c()) * _Qb[beta].entropy();
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            sum += Complex(grm().OR(alpha).c()) * _Qa[alpha].entropy();
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();
        }
        return sum;
    }